

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void av1_calc_proj_params_high_bd_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t *piVar9;
  long *plVar10;
  int j_1;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    lVar6 = (long)src8 * 2;
    lVar7 = (long)dat8 * 2;
    piVar9 = H[1] + 1;
    plVar10 = C + 1;
    uVar13 = 0;
    uVar11 = 0;
    if (0 < width) {
      uVar11 = (ulong)(uint)width;
    }
    uVar12 = 0;
    if (0 < height) {
      uVar12 = (ulong)(uint)height;
    }
    for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
      for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        uVar1 = *(ushort *)(lVar7 + uVar5 * 2);
        uVar2 = *(ushort *)(lVar6 + uVar5 * 2);
        lVar3 = (long)flt1[uVar5] + (ulong)uVar1 * -0x10;
        *piVar9 = *piVar9 + lVar3 * lVar3;
        *plVar10 = *plVar10 + ((ulong)uVar2 - (ulong)uVar1) * lVar3 * 0x10;
      }
      flt1 = flt1 + flt1_stride;
      lVar6 = lVar6 + (long)src_stride * 2;
      lVar7 = lVar7 + (long)dat_stride * 2;
    }
  }
  else {
    lVar6 = (long)src8 * 2;
    lVar7 = (long)dat8 * 2;
    if (0 < params->r[1]) {
      plVar10 = C + 1;
      uVar13 = 0;
      uVar11 = 0;
      if (0 < width) {
        uVar11 = (ulong)(uint)width;
      }
      uVar12 = 0;
      if (0 < height) {
        uVar12 = (ulong)(uint)height;
      }
      for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
          uVar1 = *(ushort *)(lVar7 + uVar5 * 2);
          uVar2 = *(ushort *)(lVar6 + uVar5 * 2);
          lVar3 = (long)flt0[uVar5] + (ulong)uVar1 * -0x10;
          lVar8 = (long)flt1[uVar5] + (ulong)uVar1 * -0x10;
          (*H)[0] = (*H)[0] + lVar3 * lVar3;
          H[1][1] = H[1][1] + lVar8 * lVar8;
          lVar4 = ((ulong)uVar2 - (ulong)uVar1) * 0x10;
          (*H)[1] = (*H)[1] + lVar8 * lVar3;
          *C = *C + lVar3 * lVar4;
          C[1] = C[1] + lVar8 * lVar4;
        }
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar6 = lVar6 + (long)src_stride * 2;
        lVar7 = lVar7 + (long)dat_stride * 2;
      }
      lVar6 = (long)(height * width);
      lVar7 = (*H)[1];
      (*H)[0] = (*H)[0] / lVar6;
      lVar7 = lVar7 / lVar6;
      (*H)[1] = lVar7;
      H[1][1] = H[1][1] / lVar6;
      H[1][0] = lVar7;
      goto LAB_001e1c18;
    }
    uVar11 = 0;
    uVar13 = 0;
    if (0 < width) {
      uVar13 = (ulong)(uint)width;
    }
    uVar12 = 0;
    if (0 < height) {
      uVar12 = (ulong)(uint)height;
    }
    for (; piVar9 = *H, plVar10 = C, uVar11 != uVar12; uVar11 = uVar11 + 1) {
      for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
        uVar1 = *(ushort *)(lVar7 + uVar5 * 2);
        uVar2 = *(ushort *)(lVar6 + uVar5 * 2);
        lVar3 = (long)flt0[uVar5] + (ulong)uVar1 * -0x10;
        (*H)[0] = (*H)[0] + lVar3 * lVar3;
        *C = *C + ((ulong)uVar2 - (ulong)uVar1) * lVar3 * 0x10;
      }
      flt0 = flt0 + flt0_stride;
      lVar6 = lVar6 + (long)src_stride * 2;
      lVar7 = lVar7 + (long)dat_stride * 2;
    }
  }
  C = piVar9;
  lVar6 = (long)(height * width);
LAB_001e1c18:
  *C = *C / lVar6;
  *plVar10 = *plVar10 / lVar6;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_c(const uint8_t *src8, int width, int height,
                                    int src_stride, const uint8_t *dat8,
                                    int dat_stride, int32_t *flt0,
                                    int flt0_stride, int32_t *flt1,
                                    int flt1_stride, int64_t H[2][2],
                                    int64_t C[2],
                                    const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_c(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, flt1,
                                     flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_c(src8, width, height, src_stride, dat8,
                                  dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_c(src8, width, height, src_stride, dat8,
                                  dat_stride, flt1, flt1_stride, H, C);
  }
}